

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintExpressionContents::visitBrOn(PrintExpressionContents *this,BrOn *curr)

{
  char *pcVar1;
  Type type;
  ostream *poVar2;
  string_view str;
  string_view str_00;
  size_t sStack_20;
  
  switch(curr->op) {
  case BrOnNull:
    poVar2 = this->o;
    pcVar1 = "br_on_null ";
    sStack_20 = 0xb;
    break;
  case BrOnNonNull:
    poVar2 = this->o;
    pcVar1 = "br_on_non_null ";
    sStack_20 = 0xf;
    break;
  case BrOnCast:
    poVar2 = this->o;
    pcVar1 = "br_on_cast ";
    sStack_20 = 0xb;
    goto LAB_00b2137d;
  case BrOnCastFail:
    poVar2 = this->o;
    pcVar1 = "br_on_cast_fail ";
    sStack_20 = 0x10;
LAB_00b2137d:
    str._M_str = pcVar1;
    str._M_len = sStack_20;
    printMedium(poVar2,str);
    Name::print(&curr->name,this->o);
    std::operator<<(this->o,' ');
    type.id = (curr->ref->type).id;
    if (type.id == 1) {
      type.id = (curr->castType).id;
    }
    printType(this,type);
    std::operator<<(this->o,' ');
    printType(this,(Type)(curr->castType).id);
    return;
  default:
    handle_unreachable("Unexpected br_on* op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x901);
  }
  str_00._M_str = pcVar1;
  str_00._M_len = sStack_20;
  printMedium(poVar2,str_00);
  Name::print(&curr->name,this->o);
  return;
}

Assistant:

void visitBrOn(BrOn* curr) {
    switch (curr->op) {
      case BrOnNull:
        printMedium(o, "br_on_null ");
        curr->name.print(o);
        return;
      case BrOnNonNull:
        printMedium(o, "br_on_non_null ");
        curr->name.print(o);
        return;
      case BrOnCast:
        printMedium(o, "br_on_cast ");
        curr->name.print(o);
        o << ' ';
        if (curr->ref->type == Type::unreachable) {
          // Need to print some reference type in the correct hierarchy rather
          // than unreachable, and the cast type itself is the best possible
          // option.
          printType(curr->castType);
        } else {
          printType(curr->ref->type);
        }
        o << ' ';
        printType(curr->castType);
        return;
      case BrOnCastFail:
        printMedium(o, "br_on_cast_fail ");
        curr->name.print(o);
        o << ' ';
        if (curr->ref->type == Type::unreachable) {
          printType(curr->castType);
        } else {
          printType(curr->ref->type);
        }
        o << ' ';
        printType(curr->castType);
        return;
    }
    WASM_UNREACHABLE("Unexpected br_on* op");
  }